

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  curl_socket_t cVar1;
  ssl_connect_state sVar2;
  ssl_backend_data *psVar3;
  ssl_backend_data *psVar4;
  ulong uVar5;
  proxy_info *ppVar6;
  ssl_config_data *psVar7;
  ssl_config_data *psVar8;
  ssl_config_data *psVar9;
  byte bVar10;
  byte bVar11;
  _Bool _Var12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  CURLcode CVar16;
  int iVar17;
  int iVar18;
  curl_proxytype cVar19;
  CURLcode CVar20;
  timediff_t tVar21;
  char *pcVar22;
  SSL_CIPHER *c;
  char *pcVar23;
  uint *puVar24;
  ulong uVar25;
  SSL_METHOD *meth;
  SSL_CTX *pSVar26;
  BIO_METHOD *pBVar27;
  BIO *pBVar28;
  curl_blob *pcVar29;
  BIO *out;
  X509 *pXVar30;
  X509_NAME *pXVar31;
  size_t sVar32;
  undefined8 uVar33;
  ASN1_INTEGER *pAVar34;
  X509_PUBKEY *pXVar35;
  X509_EXTENSION *ex;
  BIO *out_00;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar36;
  EVP_PKEY *pkey;
  X509 *pXVar37;
  GENERAL_NAMES *a_00;
  undefined8 extraout_RAX;
  undefined8 uVar38;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  void *__src;
  int *piVar39;
  curl_blob **ppcVar40;
  size_t sVar41;
  OCSP_RESPONSE *resp;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  stack_st_X509 *certs;
  X509_STORE *pXVar42;
  X509 *issuer;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  SSL *ssl;
  long lVar43;
  long lVar44;
  long lVar45;
  curl_socket_t writefd;
  long lVar46;
  size_t size;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  long lVar47;
  curl_socket_t readfd0;
  undefined8 in_R9;
  undefined7 uVar48;
  ASN1_OBJECT *bn;
  char **ppcVar49;
  char **ppcVar50;
  int iVar51;
  bool bVar52;
  byte local_a70;
  undefined4 local_a64;
  void *ssl_sessionid;
  char *ptr;
  X509 *local_a48;
  char *local_a40;
  char *local_a38;
  curl_blob *local_a30;
  ASN1_OBJECT *pubkeyoid;
  char *local_a20;
  X509_ALGOR *sigalg;
  ulong local_a10;
  ASN1_BIT_STRING *psig;
  int local_a00;
  int crl_reason;
  char *local_9f8;
  curl_blob *local_9f0;
  long local_9e8;
  curl_socket_t local_9dc;
  _Bool *local_9d8;
  long local_9d0;
  long local_9c8;
  char *local_9c0;
  in6_addr addr;
  char extramsg [80];
  char error_buffer [256];
  
  lVar43 = (long)sockindex;
  if (conn->ssl[lVar43].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  cVar1 = conn->sock[lVar43];
  local_9d8 = done;
  local_9d0 = lVar43;
  if (conn->ssl[lVar43].connecting_state == ssl_connect_1) {
    tVar21 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar21 < 0) {
LAB_001506b4:
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    local_9dc = conn->sock[local_9d0];
    ssl_sessionid = (void *)0x0;
    uVar48 = (undefined7)((ulong)in_R9 >> 8);
    if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
      if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
        local_9f8 = (conn->host).name;
        local_a48 = (X509 *)(conn->ssl_config).version;
        pcVar29 = (conn->ssl_config).ca_info_blob;
        local_a40 = (data->set).ssl.primary.clientcert;
        local_a30 = (data->set).ssl.primary.cert_blob;
        local_a20 = (data->set).ssl.cert_type;
        lVar44 = 0x618;
        lVar45 = 0x300;
        lVar46 = 0x2a8;
        local_9f0 = (curl_blob *)0x0;
        if (pcVar29 == (curl_blob *)0x0) {
          local_a10 = CONCAT71(uVar48,1);
          goto LAB_001506d0;
        }
      }
      else {
        local_9f8 = (conn->http_proxy).host.name;
        local_a48 = (X509 *)(conn->proxy_ssl_config).version;
        pcVar29 = (conn->proxy_ssl_config).ca_info_blob;
        local_a40 = (data->set).proxy_ssl.primary.clientcert;
        local_a30 = (data->set).proxy_ssl.primary.cert_blob;
        local_a20 = (data->set).proxy_ssl.cert_type;
        lVar44 = 0x6e8;
        lVar45 = 0x370;
        lVar46 = 0x318;
        local_9f0 = (curl_blob *)0x0;
        if (pcVar29 == (curl_blob *)0x0) {
          local_a10 = CONCAT71(uVar48,1);
          lVar47 = 800;
          goto LAB_001508a7;
        }
      }
      local_a10 = 0;
      local_9e8 = 0;
      local_9f0 = pcVar29;
    }
    else {
      local_9f8 = (conn->host).name;
      local_a48 = (X509 *)(conn->ssl_config).version;
      local_9f0 = (conn->ssl_config).ca_info_blob;
      local_a40 = (data->set).ssl.primary.clientcert;
      local_a30 = (data->set).ssl.primary.cert_blob;
      local_a20 = (data->set).ssl.cert_type;
      lVar44 = 0x618;
      lVar45 = 0x300;
      lVar46 = 0x2a8;
      local_a10 = CONCAT71(uVar48,local_9f0 == (curl_blob *)0x0);
      if (local_9f0 == (curl_blob *)0x0) {
LAB_001506d0:
        lVar46 = 0x2a8;
        lVar45 = 0x300;
        lVar44 = 0x618;
        lVar47 = 0x2b0;
LAB_001508a7:
        local_9e8 = *(long *)((conn->chunk).hexbuffer + lVar47 + -0x3d);
      }
      else {
        local_9e8 = 0;
      }
    }
    local_9c8 = *(long *)((conn->chunk).hexbuffer + lVar46 + -0x3d);
    local_a70 = (conn->chunk).hexbuffer[lVar45 + -0x3d];
    local_a38 = *(char **)((long)&data->magic + lVar44);
    psVar3 = conn->ssl[lVar43].backend;
    local_a00 = sockindex;
    CVar16 = ossl_seed(data);
    pXVar30 = local_a48;
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar44 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x610;
    }
    *(undefined8 *)((long)&data->magic + lVar44) = 1;
    if ((X509 *)0x7 < local_a48) {
      Curl_failf(data,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
    if ((0xf3UL >> ((ulong)local_a48 & 0x3f) & 1) == 0) {
      if (local_a48 == (X509 *)0x2) {
        pcVar22 = "No SSLv2 support";
      }
      else {
        pcVar22 = "No SSLv3 support";
      }
      Curl_failf(data,pcVar22);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    if ((SSL_CTX *)psVar3->ctx != (SSL_CTX *)0x0) {
      SSL_CTX_free((SSL_CTX *)psVar3->ctx);
    }
    pSVar26 = SSL_CTX_new(meth);
    psVar3->ctx = (SSL_CTX *)pSVar26;
    if (pSVar26 == (SSL_CTX *)0x0) {
      uVar25 = ERR_peek_error();
      ossl_strerror(uVar25,error_buffer,size_00);
      Curl_failf(data,"SSL: couldn\'t create a context: %s",error_buffer);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar26,0x21,0x10,(void *)0x0);
    if (((data->set).fdebug != (curl_debug_callback)0x0) && (((data->set).field_0x9a3 & 0x40) != 0))
    {
      SSL_CTX_set_msg_callback((SSL_CTX *)psVar3->ctx,ossl_trace);
      SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x10,0,conn);
      (conn->ssl[0].backend)->logger = data;
    }
    uVar33 = 0x82024850;
    cVar19 = (conn->http_proxy).proxytype;
    if ((cVar19 == CURLPROXY_HTTPS) &&
       (iVar13 = conn->sock[1], conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete)) {
      if (((data->set).proxy_ssl.field_0xc8 & 4) == 0) {
LAB_001516da:
        uVar33 = 0x82024050;
        goto LAB_001516e1;
      }
      if (((ulong)pXVar30 & 0xfffffffffffffffe) == 2) {
        return CURLE_NOT_BUILT_IN;
      }
      pSVar26 = (SSL_CTX *)psVar3->ctx;
LAB_0015175e:
      lVar44 = 0x308;
      if (conn->proxy_ssl[iVar13 != -1].state == ssl_connection_complete) {
        lVar44 = 0x298;
      }
    }
    else {
      if (((data->set).ssl.field_0xc8 & 4) == 0) goto LAB_001516da;
LAB_001516e1:
      if (((ulong)pXVar30 & 0xfffffffffffffffe) == 2) {
        return CURLE_NOT_BUILT_IN;
      }
      pSVar26 = (SSL_CTX *)psVar3->ctx;
      lVar44 = 0x298;
      if (cVar19 == CURLPROXY_HTTPS) {
        iVar13 = conn->sock[1];
        goto LAB_0015175e;
      }
    }
    switch(*(undefined8 *)((conn->chunk).hexbuffer + lVar44 + -0x3d)) {
    case 0:
      goto switchD_001517a0_caseD_0;
    case 1:
    case 4:
      lVar44 = 0x301;
      break;
    default:
      lVar44 = 0;
      break;
    case 5:
      lVar44 = 0x302;
      break;
    case 6:
      lVar44 = 0x303;
      break;
    case 7:
      lVar44 = 0x304;
    }
    lVar44 = SSL_CTX_ctrl(pSVar26,0x7b,lVar44,(void *)0x0);
    if (lVar44 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    cVar19 = (conn->http_proxy).proxytype;
switchD_001517a0_caseD_0:
    if ((cVar19 != CURLPROXY_HTTPS) ||
       (lVar44 = 0x310, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x2a0;
    }
    uVar25 = *(ulong *)((conn->chunk).hexbuffer + lVar44 + -0x3d);
    uVar5 = uVar25 << 0x30;
    uVar25 = uVar25 >> 0x10;
    lVar44 = (uVar5 | uVar25) + 0x2fd;
    if ((uVar5 | uVar25 & 0xfffffffffffffffc) != 4) {
      lVar44 = 0;
    }
    lVar44 = SSL_CTX_ctrl(pSVar26,0x7c,lVar44,(void *)0x0);
    CVar16 = CURLE_SSL_CONNECT_ERROR;
    if (lVar44 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_CTX_set_options(psVar3->ctx,uVar33);
    uVar14 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
    if ((uVar14 >> 0x1b & 1) != 0) {
      SSL_CTX_set_next_proto_select_cb((SSL_CTX *)psVar3->ctx,select_next_proto_cb,data);
      uVar14 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
    }
    if ((uVar14 >> 0x1c & 1) != 0) {
      builtin_strncpy(extramsg,"\bhttp/1.1",9);
      Curl_infof(data,"ALPN, offering %s","http/1.1");
      iVar13 = SSL_CTX_set_alpn_protos(psVar3->ctx,extramsg,9);
      if (iVar13 != 0) {
        Curl_failf(data,"Error setting ALPN");
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    if ((local_a40 != (char *)0x0 || local_a30 != (curl_blob *)0x0) || local_a20 != (char *)0x0) {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        psVar7 = &(data->set).ssl;
        psVar8 = &(data->set).ssl;
        psVar9 = &(data->set).ssl;
        bVar52 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar52) {
          psVar9 = &(data->set).proxy_ssl;
          psVar7 = &(data->set).proxy_ssl;
          psVar8 = &(data->set).proxy_ssl;
        }
        ppcVar40 = &psVar8->key_blob;
        ppcVar50 = &psVar7->key;
        ppcVar49 = &psVar9->key_type;
        lVar44 = 0x730;
        if (bVar52) {
          lVar44 = 0x660;
        }
      }
      else {
        ppcVar50 = &(data->set).ssl.key;
        ppcVar40 = &(data->set).ssl.key_blob;
        ppcVar49 = &(data->set).ssl.key_type;
        lVar44 = 0x660;
      }
      iVar13 = cert_stuff(data,psVar3->ctx,local_a40,local_a30,local_a20,*ppcVar50,*ppcVar40,
                          *ppcVar49,*(char **)((long)&data->magic + lVar44));
      if (iVar13 == 0) {
        return CURLE_SSL_CERTPROBLEM;
      }
    }
    cVar19 = (conn->http_proxy).proxytype;
    if ((cVar19 != CURLPROXY_HTTPS) ||
       (lVar44 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x2d0;
    }
    pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar44 + -0x3d);
    if (pcVar22 != (char *)0x0) {
      iVar13 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar3->ctx,pcVar22);
      if (iVar13 == 0) {
        pcVar23 = "failed setting cipher list: %s";
        goto LAB_00151e3a;
      }
      Curl_infof(data,"Cipher selection: %s",pcVar22);
      cVar19 = (conn->http_proxy).proxytype;
    }
    if ((cVar19 != CURLPROXY_HTTPS) ||
       (lVar44 = 0x348, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x2d8;
    }
    pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar44 + -0x3d);
    if (pcVar22 != (char *)0x0) {
      iVar13 = SSL_CTX_set_ciphersuites(psVar3->ctx,pcVar22);
      if (iVar13 == 0) {
        pcVar23 = "failed setting TLS 1.3 cipher suite: %s";
        goto LAB_00151e3a;
      }
      Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar22);
    }
    SSL_CTX_set_post_handshake_auth(psVar3->ctx,1);
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar44 = 0x368, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x2f8;
    }
    pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar44 + -0x3d);
    if ((pcVar22 != (char *)0x0) &&
       (lVar44 = SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x5c,0,pcVar22), lVar44 == 0)) {
      pcVar23 = "failed setting curves list: \'%s\'";
LAB_00151e3a:
      Curl_failf(data,pcVar23,pcVar22);
      return CURLE_SSL_CIPHER;
    }
    uVar14 = local_a70 & 1;
    local_a70 = local_a70 & 1;
    bVar10 = local_a70;
    local_a70 = (byte)uVar14;
    if (((char)local_a10 == '\0') &&
       (CVar20 = load_cacert_from_memory(psVar3->ctx,local_9f0), CVar20 != CURLE_OK)) {
      if (CVar20 == CURLE_OUT_OF_MEMORY) {
        pcVar22 = "error importing CA certificate blob";
        goto LAB_00152ca8;
      }
      if (local_a70 != '\0') {
        Curl_failf(data,"error importing CA certificate blob");
        if (CVar20 != CURLE_OK) {
          return CVar20;
        }
        goto LAB_001502da;
      }
      Curl_infof(data,"error importing CA certificate blob, continuing anyway");
    }
    lVar44 = local_9e8;
    if (local_9e8 != 0) {
      iVar13 = SSL_CTX_load_verify_file(psVar3->ctx,local_9e8);
      if (iVar13 == 0) {
        if (local_a70 != '\0') {
          pcVar22 = "error setting certificate file: %s";
          goto LAB_0015296b;
        }
        Curl_infof(data,"error setting certificate file, continuing anyway");
      }
      Curl_infof(data," CAfile: %s",lVar44);
    }
    lVar44 = local_9c8;
    if (local_9c8 != 0) {
      iVar13 = SSL_CTX_load_verify_dir(psVar3->ctx,local_9c8);
      if (iVar13 == 0) {
        if (bVar10 != 0) {
          pcVar22 = "error setting certificate path: %s";
LAB_0015296b:
          Curl_failf(data,pcVar22,lVar44);
          return CURLE_SSL_CACERT_BADFILE;
        }
        Curl_infof(data,"error setting certificate path, continuing anyway");
      }
      Curl_infof(data," CApath: %s",lVar44);
    }
    if (local_a38 != (char *)0x0) {
      pXVar42 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(pXVar42,m);
      if ((ctx == (X509_LOOKUP *)0x0) || (iVar13 = X509_load_crl_file(ctx,local_a38,1), iVar13 == 0)
         ) {
        Curl_failf(data,"error loading CRL file: %s",local_a38);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(data,"successfully load CRL file:");
      pXVar42 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      X509_STORE_set_flags(pXVar42,0xc);
      Curl_infof(data,"  CRLfile: %s",local_a38);
    }
    if (bVar10 != 0) {
      pXVar42 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      X509_STORE_set_flags(pXVar42,0x8000);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if (local_a38 == (char *)0x0) {
          bVar10 = (data->set).proxy_ssl.field_0xc8;
LAB_00152abc:
          if ((bVar10 & 0x10) == 0) {
            pXVar42 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
            X509_STORE_set_flags(pXVar42,0x80000);
          }
        }
      }
      else if (local_a38 == (char *)0x0) {
        bVar10 = (data->set).ssl.field_0xc8;
        goto LAB_00152abc;
      }
    }
    SSL_CTX_set_verify((SSL_CTX *)psVar3->ctx,uVar14,(callback *)0x0);
    _Var12 = Curl_tls_keylog_enabled();
    if (_Var12) {
      SSL_CTX_set_keylog_callback(psVar3->ctx,ossl_keylog_callback);
    }
    SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x2c,0x301,(void *)0x0);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar3->ctx,ossl_new_session_cb);
    if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
      Curl_set_in_callback(data,true);
      CVar20 = (*(data->set).ssl.fsslctx)(data,psVar3->ctx,(data->set).ssl.fsslctxp);
      Curl_set_in_callback(data,false);
      if (CVar20 != CURLE_OK) {
        Curl_failf(data,"error signaled by ssl ctx callback");
        return CVar20;
      }
    }
    if ((SSL *)psVar3->handle != (SSL *)0x0) {
      SSL_free((SSL *)psVar3->handle);
    }
    ssl = SSL_new((SSL_CTX *)psVar3->ctx);
    psVar3->handle = (SSL *)ssl;
    if (ssl == (SSL *)0x0) {
      pcVar22 = "SSL: couldn\'t create a context (handle)!";
LAB_00152ca8:
      Curl_failf(data,pcVar22);
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (conn->proxy_ssl_config).field_0x68;
    }
    else {
      bVar10 = (conn->ssl_config).field_0x68;
    }
    if ((bVar10 & 4) != 0) {
      SSL_ctrl(ssl,0x41,1,(void *)0x0);
      ssl = (SSL *)psVar3->handle;
    }
    SSL_set_connect_state(ssl);
    pcVar22 = local_9f8;
    psVar3->server_cert = (X509 *)0x0;
    iVar13 = inet_pton(2,local_9f8,&addr);
    if ((iVar13 == 0) && (iVar13 = inet_pton(10,pcVar22,&addr), iVar13 == 0)) {
      sVar41 = strlen(pcVar22);
      if ((data->set).buffer_size <= (long)sVar41) {
        return CURLE_SSL_CONNECT_ERROR;
      }
      Curl_strntolower((data->state).buffer,local_9f8,sVar41);
      (data->state).buffer[sVar41] = '\0';
      lVar44 = SSL_ctrl((SSL *)psVar3->handle,0x37,0,(data->state).buffer);
      if (lVar44 == 0) {
        Curl_infof(data,"WARNING: failed to configure server name indication (SNI) TLS extension");
      }
    }
    ossl_associate_connection(data,conn,local_a00);
    Curl_ssl_sessionid_lock(data);
    if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
      _Var12 = conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete;
    }
    else {
      _Var12 = false;
    }
    _Var12 = Curl_ssl_getsessionid(data,conn,_Var12,&ssl_sessionid,(size_t *)0x0,local_a00);
    if (!_Var12) {
      iVar13 = SSL_set_session((SSL *)psVar3->handle,(SSL_SESSION *)ssl_sessionid);
      if (iVar13 == 0) {
        Curl_ssl_sessionid_unlock(data);
        uVar25 = ERR_get_error();
        ossl_strerror(uVar25,error_buffer,size_05);
        pcVar22 = "SSL: SSL_set_session failed: %s";
        goto LAB_00151b36;
      }
      Curl_infof(data,"SSL re-using session ID");
    }
    Curl_ssl_sessionid_unlock(data);
    if ((conn->proxy_ssl[lVar43].field_0x10 & 1) == 0) {
      iVar13 = SSL_set_fd((SSL *)psVar3->handle,local_9dc);
      if (iVar13 == 0) {
        uVar25 = ERR_get_error();
        ossl_strerror(uVar25,error_buffer,size_04);
        pcVar22 = "SSL: SSL_set_fd failed: %s";
LAB_00151b36:
        Curl_failf(data,pcVar22,error_buffer);
        return CVar16;
      }
    }
    else {
      pBVar27 = BIO_f_ssl();
      pBVar28 = BIO_new(pBVar27);
      BIO_ctrl(pBVar28,0x6d,0,(conn->proxy_ssl[lVar43].backend)->handle);
      SSL_set_bio((SSL *)psVar3->handle,pBVar28,pBVar28);
    }
    conn->ssl[lVar43].connecting_state = ssl_connect_2;
  }
LAB_001502da:
  while (sVar2 = conn->ssl[lVar43].connecting_state, sVar2 - ssl_connect_2 < 3) {
    tVar21 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar21 < 0) goto LAB_001506b4;
    sVar2 = conn->ssl[lVar43].connecting_state;
    if ((sVar2 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar2 == ssl_connect_2_writing) {
        writefd = cVar1;
      }
      readfd0 = -1;
      if (sVar2 == ssl_connect_2_reading) {
        readfd0 = cVar1;
      }
      if (nonblocking) {
        tVar21 = 0;
      }
      iVar13 = Curl_socket_check(readfd0,-1,writefd,tVar21);
      if (iVar13 < 0) {
        puVar24 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar24);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar13 == 0) {
        if (nonblocking) {
          *local_9d8 = false;
          return CURLE_OK;
        }
        goto LAB_001506b4;
      }
    }
    psVar3 = conn->ssl[lVar43].backend;
    ERR_clear_error();
    iVar13 = SSL_connect((SSL *)psVar3->handle);
    if (iVar13 == 1) {
      conn->ssl[lVar43].connecting_state = ssl_connect_3;
      pcVar22 = SSL_get_version((SSL *)psVar3->handle);
      c = SSL_get_current_cipher((SSL *)psVar3->handle);
      pcVar23 = SSL_CIPHER_get_name(c);
      Curl_infof(data,"SSL connection using %s / %s",pcVar22,pcVar23);
      if (((conn->bits).field_0x7 & 0x10) != 0) {
        SSL_get0_alpn_selected(psVar3->handle,error_buffer,extramsg);
        if (extramsg._0_4_ == 0) {
          Curl_infof(data,"ALPN, server did not agree to a protocol");
        }
        else {
          Curl_infof(data,"ALPN, server accepted to use %.*s",(ulong)(uint)extramsg._0_4_,
                     error_buffer._0_8_);
          if ((extramsg._0_4_ == 8) && (*(long *)error_buffer._0_8_ == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
        Curl_multiuse_state(data,(uint)(conn->negnpn == 3) * 3 + -1);
      }
    }
    else {
      uVar14 = SSL_get_error((SSL *)psVar3->handle,iVar13);
      if (uVar14 == 9) {
        conn->ssl[lVar43].connecting_state = ssl_connect_2;
      }
      else if (uVar14 == 3) {
        conn->ssl[lVar43].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar14 != 2) {
          memset(error_buffer,0,0x100);
          conn->ssl[lVar43].connecting_state = ssl_connect_2;
          uVar25 = ERR_get_error();
          uVar15 = (uint)uVar25;
          if ((uVar15 & 0xff800000) == 0xa000000 && -1 < (int)uVar15) {
            uVar15 = uVar15 & 0x7fffff;
            if (uVar15 != 0x86) {
              if (uVar15 == 0x45c) {
                ossl_strerror(uVar25,error_buffer,size);
                CVar16 = CURLE_SSL_CLIENTCERT;
                goto LAB_00151b24;
              }
              if (uVar15 != 0x415) goto LAB_00150a8a;
            }
            lVar43 = SSL_get_verify_result((SSL *)psVar3->handle);
            if (lVar43 == 0) {
              builtin_strncpy(error_buffer,"SSL certificate verification failed",0x24);
              CVar16 = CURLE_PEER_FAILED_VERIFICATION;
            }
            else {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar44 = 0x6e0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar44 = 0x610;
              }
              *(long *)((long)&data->magic + lVar44) = lVar43;
              pcVar22 = X509_verify_cert_error_string(lVar43);
              curl_msnprintf(error_buffer,0x100,"SSL certificate problem: %s",pcVar22);
              CVar16 = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
          else {
LAB_00150a8a:
            ossl_strerror(uVar25,error_buffer,size);
            CVar16 = CURLE_SSL_CONNECT_ERROR;
            if (uVar25 == 0) {
              if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
                bVar52 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
                ppVar6 = &conn->http_proxy;
                if (bVar52) {
                  ppVar6 = (proxy_info *)&conn->host;
                }
                lVar43 = (ulong)bVar52 * 4 + 0x160;
              }
              else {
                ppVar6 = (proxy_info *)&conn->host;
                lVar43 = 0x164;
              }
              pcVar22 = (ppVar6->host).name;
              iVar13 = *(int *)((conn->chunk).hexbuffer + lVar43 + -0x3d);
              extramsg[0x40] = '\0';
              extramsg[0x41] = '\0';
              extramsg[0x42] = '\0';
              extramsg[0x43] = '\0';
              extramsg[0x44] = '\0';
              extramsg[0x45] = '\0';
              extramsg[0x46] = '\0';
              extramsg[0x47] = '\0';
              extramsg[0x48] = '\0';
              extramsg[0x49] = '\0';
              extramsg[0x4a] = '\0';
              extramsg[0x4b] = '\0';
              extramsg[0x4c] = '\0';
              extramsg[0x4d] = '\0';
              extramsg[0x4e] = '\0';
              extramsg[0x4f] = '\0';
              extramsg[0x30] = '\0';
              extramsg[0x31] = '\0';
              extramsg[0x32] = '\0';
              extramsg[0x33] = '\0';
              extramsg[0x34] = '\0';
              extramsg[0x35] = '\0';
              extramsg[0x36] = '\0';
              extramsg[0x37] = '\0';
              extramsg[0x38] = '\0';
              extramsg[0x39] = '\0';
              extramsg[0x3a] = '\0';
              extramsg[0x3b] = '\0';
              extramsg[0x3c] = '\0';
              extramsg[0x3d] = '\0';
              extramsg[0x3e] = '\0';
              extramsg[0x3f] = '\0';
              extramsg[0x20] = '\0';
              extramsg[0x21] = '\0';
              extramsg[0x22] = '\0';
              extramsg[0x23] = '\0';
              extramsg[0x24] = '\0';
              extramsg[0x25] = '\0';
              extramsg[0x26] = '\0';
              extramsg[0x27] = '\0';
              extramsg[0x28] = '\0';
              extramsg[0x29] = '\0';
              extramsg[0x2a] = '\0';
              extramsg[0x2b] = '\0';
              extramsg[0x2c] = '\0';
              extramsg[0x2d] = '\0';
              extramsg[0x2e] = '\0';
              extramsg[0x2f] = '\0';
              extramsg[0x10] = '\0';
              extramsg[0x11] = '\0';
              extramsg[0x12] = '\0';
              extramsg[0x13] = '\0';
              extramsg[0x14] = '\0';
              extramsg[0x15] = '\0';
              extramsg[0x16] = '\0';
              extramsg[0x17] = '\0';
              extramsg[0x18] = '\0';
              extramsg[0x19] = '\0';
              extramsg[0x1a] = '\0';
              extramsg[0x1b] = '\0';
              extramsg[0x1c] = '\0';
              extramsg[0x1d] = '\0';
              extramsg[0x1e] = '\0';
              extramsg[0x1f] = '\0';
              extramsg[0] = '\0';
              extramsg[1] = '\0';
              extramsg[2] = '\0';
              extramsg[3] = '\0';
              extramsg[4] = '\0';
              extramsg[5] = '\0';
              extramsg[6] = '\0';
              extramsg[7] = '\0';
              extramsg[8] = '\0';
              extramsg[9] = '\0';
              extramsg[10] = '\0';
              extramsg[0xb] = '\0';
              extramsg[0xc] = '\0';
              extramsg[0xd] = '\0';
              extramsg[0xe] = '\0';
              extramsg[0xf] = '\0';
              piVar39 = __errno_location();
              if (uVar14 == 5 && *piVar39 != 0) {
                Curl_strerror(*piVar39,extramsg,0x50);
                pcVar23 = "SSL_ERROR_SYSCALL";
                if (extramsg[0] != '\0') {
                  pcVar23 = extramsg;
                }
              }
              else if (uVar14 < 0xb) {
                pcVar23 = (&PTR_anon_var_dwarf_1309c4_00171c38)[uVar14];
              }
              else {
                pcVar23 = "SSL_ERROR unknown";
              }
              Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar23,pcVar22,
                         (long)iVar13);
              return CURLE_SSL_CONNECT_ERROR;
            }
          }
LAB_00151b24:
          pcVar22 = "%s";
          goto LAB_00151b36;
        }
        conn->ssl[lVar43].connecting_state = ssl_connect_2_reading;
      }
    }
    if ((nonblocking) && (conn->ssl[lVar43].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar2 != ssl_connect_3) {
    if (sVar2 == ssl_connect_done) goto LAB_001505c3;
    _Var12 = false;
    goto LAB_0015071f;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar10 = (conn->proxy_ssl_config).field_0x68;
  }
  else {
    bVar10 = (conn->ssl_config).field_0x68;
  }
  bVar11 = 1;
  if ((bVar10 & 1) == 0) {
    bVar11 = (bVar10 & 2) >> 1;
  }
  local_a40 = (char *)CONCAT71(local_a40._1_7_,bVar11);
  memset(extramsg,0,0x100);
  pBVar27 = BIO_s_mem();
  pBVar28 = BIO_new(pBVar27);
  psVar3 = conn->ssl[lVar43].backend;
  if ((((data->set).ssl.field_0xc8 & 1) == 0) ||
     (pcVar29 = (curl_blob *)SSL_get_peer_cert_chain((SSL *)psVar3->handle),
     pcVar29 == (curl_blob *)0x0)) goto LAB_00151326;
  iVar13 = OPENSSL_sk_num(pcVar29);
  CVar16 = Curl_ssl_init_certinfo(data,iVar13);
  if (CVar16 != CURLE_OK) goto LAB_00151326;
  pBVar27 = BIO_s_mem();
  out = BIO_new(pBVar27);
  if (iVar13 < 1) goto LAB_0015130f;
  iVar51 = 0;
  local_a20 = (char *)CONCAT44(local_a20._4_4_,iVar13);
  local_a30 = pcVar29;
  do {
    pXVar30 = (X509 *)OPENSSL_sk_value(pcVar29,iVar51);
    psig = (ASN1_BIT_STRING *)0x0;
    pXVar31 = X509_get_subject_name(pXVar30);
    X509_NAME_print_ex(out,pXVar31,0,0x82031f);
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Subject",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    pXVar31 = X509_get_issuer_name(pXVar30);
    X509_NAME_print_ex(out,pXVar31,0,0x82031f);
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Issuer",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    uVar33 = X509_get_version(pXVar30);
    BIO_printf(out,"%lx",uVar33);
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Version",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    local_a48 = pXVar30;
    pAVar34 = X509_get_serialNumber(pXVar30);
    if (pAVar34->type == 0x102) {
      BIO_puts(out,"-");
    }
    if (0 < pAVar34->length) {
      lVar44 = 0;
      do {
        BIO_printf(out,"%02x",(ulong)pAVar34->data[lVar44]);
        lVar44 = lVar44 + 1;
      } while (lVar44 < pAVar34->length);
    }
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Serial Number",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    sigalg = (X509_ALGOR *)0x0;
    pubkeyoid = (ASN1_OBJECT *)0x0;
    X509_get0_signature(&psig,&sigalg,local_a48);
    if (sigalg != (X509_ALGOR *)0x0) {
      i2a_ASN1_OBJECT(out,(ASN1_OBJECT *)sigalg->algorithm);
      sVar32 = BIO_ctrl(out,3,0,&ptr);
      Curl_ssl_push_certinfo_len(data,iVar51,"Signature Algorithm",ptr,sVar32);
      BIO_ctrl(out,1,0,(void *)0x0);
    }
    pXVar35 = (X509_PUBKEY *)X509_get_X509_PUBKEY(local_a48);
    if ((pXVar35 != (X509_PUBKEY *)0x0) &&
       (X509_PUBKEY_get0_param
                  ((ASN1_OBJECT **)&pubkeyoid,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,pXVar35),
       pubkeyoid != (ASN1_OBJECT *)0x0)) {
      i2a_ASN1_OBJECT(out,(ASN1_OBJECT *)pubkeyoid);
      sVar32 = BIO_ctrl(out,3,0,&ptr);
      Curl_ssl_push_certinfo_len(data,iVar51,"Public Key Algorithm",ptr,sVar32);
      BIO_ctrl(out,1,0,(void *)0x0);
    }
    uVar33 = X509_get0_extensions(local_a48);
    iVar13 = OPENSSL_sk_num(uVar33);
    if ((0 < iVar13) && (iVar13 = OPENSSL_sk_num(uVar33), 0 < iVar13)) {
      iVar13 = 0;
      do {
        ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar33,iVar13);
        pBVar27 = BIO_s_mem();
        out_00 = BIO_new(pBVar27);
        if (out_00 == (BIO *)0x0) break;
        a = X509_EXTENSION_get_object(ex);
        i2t_ASN1_OBJECT((char *)&addr,0x80,a);
        iVar17 = X509V3_EXT_print(out_00,ex,0,0);
        if (iVar17 == 0) {
          v = X509_EXTENSION_get_data(ex);
          ASN1_STRING_print(out_00,v);
        }
        BIO_ctrl(out_00,0x73,0,&ssl_sessionid);
        Curl_ssl_push_certinfo_len
                  (data,iVar51,(char *)&addr,*(char **)((long)ssl_sessionid + 8),*ssl_sessionid);
        BIO_free(out_00);
        iVar13 = iVar13 + 1;
        iVar17 = OPENSSL_sk_num(uVar33);
      } while (iVar13 < iVar17);
    }
    pXVar30 = local_a48;
    pAVar36 = (ASN1_TIME *)X509_get0_notBefore(local_a48);
    ASN1_TIME_print(out,pAVar36);
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Start date",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    pAVar36 = (ASN1_TIME *)X509_get0_notAfter(pXVar30);
    ASN1_TIME_print(out,pAVar36);
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Expire date",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    pkey = X509_get_pubkey(pXVar30);
    if (pkey == (EVP_PKEY *)0x0) {
      Curl_infof(data,"   Unable to load public key");
      pcVar29 = local_a30;
    }
    else {
      iVar13 = EVP_PKEY_get_id(pkey);
      pcVar29 = local_a30;
      if (iVar13 == 0x74) {
        uVar33 = EVP_PKEY_get0_DSA(pkey);
        DSA_get0_pqg(uVar33,&addr,&ssl_sessionid,&sigalg);
        DSA_get0_key(uVar33,&pubkeyoid,0);
        pcVar22 = "dsa";
LAB_001511b6:
        pubkey_show(data,(BIO *)out,iVar51,pcVar22,"p",(BIGNUM *)addr.__in6_u._0_8_);
        pubkey_show(data,(BIO *)out,iVar51,pcVar22,"q",(BIGNUM *)ssl_sessionid);
        pubkey_show(data,(BIO *)out,iVar51,pcVar22,"g",(BIGNUM *)sigalg);
        pcVar23 = "pub_key";
        bn = pubkeyoid;
LAB_00151217:
        pubkey_show(data,(BIO *)out,iVar51,pcVar22,pcVar23,(BIGNUM *)bn);
      }
      else {
        if (iVar13 == 0x1c) {
          uVar33 = EVP_PKEY_get0_DH(pkey);
          DH_get0_pqg(uVar33,&addr,&ssl_sessionid,&sigalg);
          DH_get0_key(uVar33,&pubkeyoid,0);
          pcVar22 = "dh";
          goto LAB_001511b6;
        }
        if (iVar13 == 6) {
          uVar33 = EVP_PKEY_get0_RSA(pkey);
          RSA_get0_key(uVar33,&addr,&ssl_sessionid,0);
          uVar14 = BN_num_bits((BIGNUM *)addr.__in6_u._0_8_);
          BIO_printf(out,"%d",(ulong)uVar14);
          sVar32 = BIO_ctrl(out,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar51,"RSA Public Key",ptr,sVar32);
          BIO_ctrl(out,1,0,(void *)0x0);
          pubkey_show(data,(BIO *)out,iVar51,"rsa","n",(BIGNUM *)addr.__in6_u._0_8_);
          pcVar22 = "rsa";
          pcVar23 = "e";
          bn = (ASN1_OBJECT *)ssl_sessionid;
          goto LAB_00151217;
        }
      }
      EVP_PKEY_free(pkey);
    }
    iVar13 = (int)local_a20;
    if (psig != (ASN1_BIT_STRING *)0x0) {
      if (0 < psig->length) {
        lVar44 = 0;
        do {
          BIO_printf(out,"%02x:",(ulong)psig->data[lVar44]);
          lVar44 = lVar44 + 1;
        } while (lVar44 < psig->length);
      }
      sVar32 = BIO_ctrl(out,3,0,&ptr);
      Curl_ssl_push_certinfo_len(data,iVar51,"Signature",ptr,sVar32);
      BIO_ctrl(out,1,0,(void *)0x0);
    }
    PEM_write_bio_X509(out,local_a48);
    sVar32 = BIO_ctrl(out,3,0,&ptr);
    Curl_ssl_push_certinfo_len(data,iVar51,"Cert",ptr,sVar32);
    BIO_ctrl(out,1,0,(void *)0x0);
    iVar51 = iVar51 + 1;
  } while (iVar51 != iVar13);
LAB_0015130f:
  BIO_free(out);
LAB_00151326:
  pXVar37 = (X509 *)SSL_get1_peer_certificate(psVar3->handle);
  psVar3->server_cert = pXVar37;
  if (pXVar37 == (X509 *)0x0) {
    BIO_free(pBVar28);
    if ((char)local_a40 != '\0') {
      Curl_failf(data,"SSL: couldn\'t get peer certificate!");
      return CURLE_PEER_FAILED_VERIFICATION;
    }
    goto LAB_001505c3;
  }
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    pcVar22 = "Proxy";
    if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
      pcVar22 = "Server";
    }
  }
  else {
    pcVar22 = "Server";
  }
  Curl_infof(data,"%s certificate:",pcVar22);
  pXVar31 = X509_get_subject_name((X509 *)psVar3->server_cert);
  iVar13 = x509_name_oneline((X509_NAME *)pXVar31,error_buffer,size_01);
  pcVar22 = "[NONE]";
  if (iVar13 == 0) {
    pcVar22 = error_buffer;
  }
  Curl_infof(data," subject: %s",pcVar22);
  pAVar36 = (ASN1_TIME *)X509_get0_notBefore(psVar3->server_cert);
  ASN1_TIME_print(pBVar28,pAVar36);
  uVar25 = BIO_ctrl(pBVar28,3,0,&local_9c0);
  Curl_infof(data," start date: %.*s",uVar25 & 0xffffffff);
  BIO_ctrl(pBVar28,1,0,(void *)0x0);
  pAVar36 = (ASN1_TIME *)X509_get0_notAfter(psVar3->server_cert);
  ASN1_TIME_print(pBVar28,pAVar36);
  uVar25 = BIO_ctrl(pBVar28,3,0,&local_9c0);
  Curl_infof(data," expire date: %.*s",uVar25 & 0xffffffff);
  BIO_ctrl(pBVar28,1,0,(void *)0x0);
  BIO_free(pBVar28);
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    if (((conn->proxy_ssl_config).field_0x68 & 2) != 0) {
      pXVar30 = (X509 *)psVar3->server_cert;
      lVar44 = 0x138;
      lVar45 = 0x130;
LAB_0015153a:
      pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar45 + -0x3d);
      pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar44 + -0x3d);
      local_a20 = pcVar22;
      if ((((conn->bits).field_0x5 & 0x10) == 0) ||
         (iVar13 = inet_pton(10,pcVar22,&addr), iVar13 == 0)) {
        iVar13 = inet_pton(2,pcVar22,&addr);
        local_a30 = (curl_blob *)(ulong)((uint)(iVar13 != 0) * 4);
        iVar13 = (uint)(iVar13 != 0) * 5 + 2;
      }
      else {
        iVar13 = 7;
        local_a30 = (curl_blob *)0x10;
      }
      uVar33 = 0;
      a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar30,0x55,(int *)0x0,(int *)0x0);
      if (a_00 != (GENERAL_NAMES *)0x0) {
        local_a38 = pcVar23;
        iVar51 = OPENSSL_sk_num(a_00);
        if (0 < iVar51) {
          local_a64 = 0;
          local_a48 = (X509 *)((ulong)local_a48 & 0xffffffff00000000);
          uVar38 = 0;
          iVar17 = 0;
LAB_00151601:
          local_a10 = CONCAT44(local_a10._4_4_,(int)uVar38);
          do {
            piVar39 = (int *)OPENSSL_sk_value(a_00,iVar17);
            iVar18 = *piVar39;
            uVar48 = (undefined7)((ulong)uVar33 >> 8);
            if (iVar18 == 2) {
              uVar33 = CONCAT71(uVar48,1);
              local_a64 = (undefined4)uVar33;
            }
            else if (iVar18 == 7) {
              uVar33 = CONCAT71(uVar48,1);
              local_a48 = (X509 *)CONCAT44(local_a48._4_4_,(int)uVar33);
            }
            if (iVar18 == iVar13) {
              pcVar22 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar39 + 2));
              iVar18 = ASN1_STRING_length(*(ASN1_STRING **)(piVar39 + 2));
              if (iVar13 == 7) {
                if ((local_a30 == (curl_blob *)(long)iVar18) &&
                   (iVar18 = bcmp(pcVar22,&addr,(size_t)local_a30), iVar18 == 0)) goto LAB_001516a4;
              }
              else if (((iVar13 == 2) &&
                       (pcVar29 = (curl_blob *)strlen(pcVar22), pcVar29 == (curl_blob *)(long)iVar18
                       )) && (iVar18 = Curl_cert_hostcheck(pcVar22,local_a20), iVar18 != 0)) {
                Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s \"%s\"",local_a38);
                goto LAB_001526eb;
              }
            }
            iVar17 = iVar17 + 1;
            if (iVar51 <= iVar17) {
              GENERAL_NAMES_free(a_00);
              pcVar22 = local_a38;
              if ((local_a10 & 1) != 0) goto LAB_00151f24;
              if ((char)local_a64 == '\0' && ((ulong)local_a48 & 1) == 0) goto LAB_0015181f;
              Curl_infof(data," subjectAltName does not match %s",local_a38);
              Curl_failf(data,
                         "SSL: no alternative certificate subject name matches target host name \'%s\'"
                         ,pcVar22);
              CVar16 = CURLE_PEER_FAILED_VERIFICATION;
              goto LAB_00151f0e;
            }
          } while( true );
        }
        GENERAL_NAMES_free(a_00);
      }
LAB_0015181f:
      ssl_sessionid = "";
      pXVar31 = X509_get_subject_name(pXVar30);
      if (pXVar31 == (X509_NAME *)0x0) {
LAB_00151e74:
        if ((char *)ssl_sessionid == "") {
          ssl_sessionid = (void *)0x0;
          goto LAB_00151ece;
        }
        if (ssl_sessionid == (void *)0x0) goto LAB_00151ece;
        iVar13 = Curl_cert_hostcheck((char *)ssl_sessionid,local_a20);
        if (iVar13 == 0) {
          Curl_failf(data,
                     "SSL: certificate subject name \'%s\' does not match target host name \'%s\'",
                     ssl_sessionid);
          goto LAB_00151ee3;
        }
        Curl_infof(data," common name: %s (matched)");
        CVar20 = CURLE_OK;
      }
      else {
        iVar13 = -1;
        do {
          iVar51 = iVar13;
          iVar13 = X509_NAME_get_index_by_NID(pXVar31,0xd,iVar51);
        } while (-1 < iVar13);
        if (iVar51 < 0) goto LAB_00151e74;
        ne = X509_NAME_get_entry(pXVar31,iVar51);
        x = X509_NAME_ENTRY_get_data(ne);
        if (x == (ASN1_STRING *)0x0) goto LAB_00151e74;
        iVar13 = ASN1_STRING_type(x);
        if (iVar13 == 0xc) {
          uVar14 = ASN1_STRING_length(x);
          if ((int)uVar14 < 0) {
            pcVar22 = "";
          }
          else {
            pcVar22 = (char *)CRYPTO_malloc(uVar14 + 1,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Rachelmorrell[P]curl/lib/vtls/openssl.c"
                                            ,0x6fa);
            ssl_sessionid = pcVar22;
            if (pcVar22 == (char *)0x0) goto LAB_00151ece;
            __src = (void *)ASN1_STRING_get0_data(x);
            memcpy(pcVar22,__src,(ulong)uVar14);
            pcVar22[uVar14] = '\0';
          }
LAB_00151e56:
          sVar41 = strlen(pcVar22);
          uVar15 = curlx_uztosi(sVar41);
          if (uVar15 == uVar14) goto LAB_00151e74;
          Curl_failf(data,"SSL: illegal cert name field");
          CVar16 = CURLE_PEER_FAILED_VERIFICATION;
          CVar20 = CURLE_PEER_FAILED_VERIFICATION;
          if ((char *)ssl_sessionid == "") goto LAB_00151f0e;
          goto LAB_00151ef3;
        }
        uVar14 = ASN1_STRING_to_UTF8((uchar **)&ssl_sessionid,x);
        pcVar22 = (char *)ssl_sessionid;
        if (ssl_sessionid != (void *)0x0) goto LAB_00151e56;
LAB_00151ece:
        Curl_failf(data,"SSL: unable to obtain common name from peer certificate");
LAB_00151ee3:
        CVar20 = CURLE_PEER_FAILED_VERIFICATION;
      }
LAB_00151ef3:
      CVar16 = CVar20;
      if (ssl_sessionid != (void *)0x0) {
        CRYPTO_free(ssl_sessionid);
      }
      if (CVar16 != CURLE_OK) {
LAB_00151f0e:
        X509_free((X509 *)psVar3->server_cert);
        psVar3->server_cert = (X509 *)0x0;
        return CVar16;
      }
    }
  }
  else if (((conn->ssl_config).field_0x68 & 2) != 0) {
    pXVar30 = (X509 *)psVar3->server_cert;
    lVar44 = 0xa8;
    lVar45 = 0xa0;
    goto LAB_0015153a;
  }
LAB_00151f24:
  pXVar31 = X509_get_issuer_name((X509 *)psVar3->server_cert);
  iVar13 = x509_name_oneline((X509_NAME *)pXVar31,error_buffer,size_02);
  if (iVar13 == 0) {
    Curl_infof(data," issuer: %s",error_buffer);
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      pcVar29 = (data->set).ssl.issuercert_blob;
      if ((data->set).ssl.issuercert == (char *)0x0) goto LAB_001520a8;
LAB_00151fca:
      if (pcVar29 != (curl_blob *)0x0) goto LAB_001520b1;
      pBVar27 = BIO_s_file();
      pBVar28 = BIO_new(pBVar27);
      if (pBVar28 == (BIO *)0x0) {
        uVar25 = ERR_get_error();
        ossl_strerror(uVar25,extramsg,size_03);
        Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",extramsg);
        X509_free((X509 *)psVar3->server_cert);
        psVar3->server_cert = (X509 *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
         (lVar44 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar44 = 0x620;
      }
      lVar44 = BIO_ctrl(pBVar28,0x6c,3,*(void **)((long)&data->magic + lVar44));
      if ((int)lVar44 < 1) {
        if ((char)local_a40 != '\0') {
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar43 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar43 = 0x620;
          }
          Curl_failf(data,"SSL: Unable to open issuer cert (%s)",
                     *(undefined8 *)((long)&data->magic + lVar43));
        }
        BIO_free(pBVar28);
        goto LAB_001521a1;
      }
LAB_001520bf:
      pXVar30 = PEM_read_bio_X509(pBVar28,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (pXVar30 == (X509 *)0x0) {
        if ((char)local_a40 != '\0') {
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar43 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar43 = 0x620;
          }
          Curl_failf(data,"SSL: Unable to read issuer cert (%s)",
                     *(undefined8 *)((long)&data->magic + lVar43));
        }
        BIO_free(pBVar28);
        pXVar30 = (X509 *)0x0;
      }
      else {
        iVar13 = X509_check_issued(pXVar30,(X509 *)psVar3->server_cert);
        if (iVar13 == 0) {
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar44 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar44 = 0x620;
          }
          Curl_infof(data," SSL certificate issuer check ok (%s)",
                     *(undefined8 *)((long)&data->magic + lVar44));
          BIO_free(pBVar28);
          X509_free(pXVar30);
          goto LAB_0015221e;
        }
        if ((char)local_a40 != '\0') {
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar43 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar43 = 0x620;
          }
          Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                     *(undefined8 *)((long)&data->magic + lVar43));
        }
        BIO_free(pBVar28);
      }
      X509_free(pXVar30);
LAB_001521a1:
      X509_free((X509 *)psVar3->server_cert);
      psVar3->server_cert = (X509 *)0x0;
      return CURLE_SSL_ISSUER_ERROR;
    }
    pcVar29 = (data->set).proxy_ssl.issuercert_blob;
    if ((data->set).proxy_ssl.issuercert != (char *)0x0) goto LAB_00151fca;
LAB_001520a8:
    if (pcVar29 != (curl_blob *)0x0) {
LAB_001520b1:
      pBVar28 = BIO_new_mem_buf(pcVar29->data,(int)pcVar29->len);
      goto LAB_001520bf;
    }
LAB_0015221e:
    lVar44 = SSL_get_verify_result((SSL *)psVar3->handle);
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      (data->set).proxy_ssl.certverifyresult = lVar44;
      if (lVar44 == 0) {
LAB_00152376:
        CVar16 = CURLE_OK;
        Curl_infof(data," SSL certificate verify ok.");
        goto LAB_0015238e;
      }
      bVar10 = (conn->proxy_ssl_config).field_0x68;
    }
    else {
      (data->set).ssl.certverifyresult = lVar44;
      if (lVar44 == 0) goto LAB_00152376;
      bVar10 = (conn->ssl_config).field_0x68;
    }
    if ((bVar10 & 1) == 0) {
      pcVar22 = X509_verify_cert_error_string(lVar44);
      CVar16 = CURLE_OK;
      Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar22,lVar44)
      ;
    }
    else {
      CVar16 = CURLE_PEER_FAILED_VERIFICATION;
      if ((char)local_a40 != '\0') {
        pcVar22 = X509_verify_cert_error_string(lVar44);
        Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar22,lVar44);
      }
    }
  }
  else {
    CVar16 = CURLE_PEER_FAILED_VERIFICATION;
    if ((char)local_a40 != '\0') {
      Curl_failf(data,"SSL: couldn\'t get X509-issuer name!");
    }
  }
LAB_0015238e:
  cVar19 = (conn->http_proxy).proxytype;
  if ((cVar19 == CURLPROXY_HTTPS) &&
     (iVar13 = conn->sock[1], conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete)) {
    if (((conn->proxy_ssl_config).field_0x68 & 4) == 0) {
      CVar20 = CURLE_OK;
      if ((char)local_a40 != '\0') {
        CVar20 = CVar16;
      }
      goto LAB_00152400;
    }
LAB_0015242b:
    psVar4 = conn->ssl[lVar43].backend;
    lVar44 = SSL_ctrl((SSL *)psVar4->handle,0x46,0,&addr);
    if (addr.__in6_u._0_8_ == 0) {
      pcVar22 = "No OCSP response received";
LAB_0015259c:
      resp = (OCSP_RESPONSE *)0x0;
LAB_0015259f:
      Curl_failf(data,pcVar22);
LAB_001525aa:
      OCSP_RESPONSE_free(resp);
      CVar20 = CURLE_SSL_INVALIDCERTSTATUS;
    }
    else {
      ssl_sessionid = (void *)addr.__in6_u._0_8_;
      resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&ssl_sessionid,lVar44);
      if (resp == (OCSP_RESPONSE *)0x0) {
        pcVar22 = "Invalid OCSP response";
        goto LAB_0015259c;
      }
      uVar14 = OCSP_response_status(resp);
      if (uVar14 != 0) {
        pcVar22 = OCSP_response_status_str((long)(int)uVar14);
        Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar22,(ulong)uVar14);
        goto LAB_001525aa;
      }
      bs = OCSP_response_get1_basic(resp);
      if (bs == (OCSP_BASICRESP *)0x0) {
        pcVar22 = "Invalid OCSP response";
        goto LAB_0015259f;
      }
      certs = SSL_get_peer_cert_chain((SSL *)psVar4->handle);
      pXVar42 = SSL_CTX_get_cert_store((SSL_CTX *)psVar4->ctx);
      iVar13 = OCSP_basic_verify(bs,certs,pXVar42,0);
      if (iVar13 < 1) {
        bVar52 = false;
        Curl_failf(data,"OCSP response verification failed");
        CVar20 = CURLE_SSL_INVALIDCERTSTATUS;
      }
      else {
        pXVar30 = (X509 *)SSL_get1_peer_certificate(psVar4->handle);
        if (pXVar30 == (X509 *)0x0) {
          pcVar22 = "Error getting peer certificate";
        }
        else {
          iVar13 = OPENSSL_sk_num(certs);
          if (0 < iVar13) {
            iVar13 = 0;
            do {
              issuer = (X509 *)OPENSSL_sk_value(certs,iVar13);
              iVar51 = X509_check_issued(issuer,pXVar30);
              if (iVar51 == 0) {
                dgst = EVP_sha1();
                id = OCSP_cert_to_id(dgst,pXVar30,issuer);
                X509_free(pXVar30);
                if (id == (OCSP_CERTID *)0x0) goto LAB_0015266d;
                iVar13 = OCSP_resp_find_status
                                   (bs,id,(int *)&pubkeyoid,&crl_reason,
                                    (ASN1_GENERALIZEDTIME **)&ptr,(ASN1_GENERALIZEDTIME **)&psig,
                                    (ASN1_GENERALIZEDTIME **)&sigalg);
                OCSP_CERTID_free(id);
                if (iVar13 != 1) {
                  pcVar22 = "Could not find certificate ID in OCSP response";
                  goto LAB_00152756;
                }
                iVar13 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)psig,
                                             (ASN1_GENERALIZEDTIME *)sigalg,300,-1);
                if (iVar13 == 0) {
                  pcVar22 = "OCSP response has expired";
                  goto LAB_00152756;
                }
                pcVar22 = OCSP_cert_status_str((long)(int)pubkeyoid);
                Curl_infof(data,"SSL certificate status: %s (%d)",pcVar22,
                           (ulong)pubkeyoid & 0xffffffff);
                if ((int)pubkeyoid == 0) {
                  bVar52 = true;
                  CVar20 = CURLE_OK;
                  goto LAB_0015276e;
                }
                if ((int)pubkeyoid != 1) {
                  CVar20 = CURLE_SSL_INVALIDCERTSTATUS;
                  bVar52 = false;
                  goto LAB_0015276e;
                }
                pcVar22 = OCSP_crl_reason_str((long)crl_reason);
                Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar22,
                           (ulong)(uint)crl_reason);
                goto LAB_00152763;
              }
              iVar13 = iVar13 + 1;
              iVar51 = OPENSSL_sk_num(certs);
            } while (iVar13 < iVar51);
          }
          X509_free(pXVar30);
LAB_0015266d:
          pcVar22 = "Error computing OCSP ID";
        }
LAB_00152756:
        Curl_failf(data,pcVar22);
LAB_00152763:
        bVar52 = false;
        CVar20 = CURLE_SSL_INVALIDCERTSTATUS;
      }
LAB_0015276e:
      OCSP_BASICRESP_free(bs);
      OCSP_RESPONSE_free(resp);
      if (bVar52) {
        cVar19 = (conn->http_proxy).proxytype;
        CVar16 = CURLE_OK;
        goto LAB_001523c2;
      }
    }
    X509_free((X509 *)psVar3->server_cert);
    psVar3->server_cert = (X509 *)0x0;
  }
  else {
    if (((conn->ssl_config).field_0x68 & 4) != 0) goto LAB_0015242b;
LAB_001523c2:
    CVar20 = CURLE_OK;
    if ((char)local_a40 != '\0') {
      CVar20 = CVar16;
    }
    lVar44 = 0x8b0;
    if (cVar19 == CURLPROXY_HTTPS) {
      iVar13 = conn->sock[1];
LAB_00152400:
      lVar44 = (ulong)(conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete) * 8 + 0x8b0;
    }
    pcVar22 = *(char **)((long)&data->magic + lVar44);
    local_9c0 = pcVar22;
    if ((CVar20 == CURLE_OK) && (pcVar22 != (char *)0x0)) {
      pXVar37 = psVar3->server_cert;
      if (pXVar37 == (X509 *)0x0) {
LAB_00152685:
        CVar20 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
      }
      else {
        pXVar35 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar37);
        uVar14 = i2d_X509_PUBKEY(pXVar35,(uchar **)0x0);
        if ((int)uVar14 < 1) goto LAB_00152685;
        uVar25 = (ulong)uVar14;
        pubkey = (uchar *)(*Curl_cmalloc)(uVar25);
        addr.__in6_u._0_8_ = pubkey;
        if (pubkey == (uchar *)0x0) goto LAB_00152685;
        pXVar35 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar37);
        uVar15 = i2d_X509_PUBKEY(pXVar35,(uchar **)&addr);
        if ((addr.__in6_u._0_8_ - (long)pubkey != uVar25 || uVar14 != uVar15) ||
            addr.__in6_u._0_8_ == 0) {
          (*Curl_cfree)(pubkey);
          goto LAB_00152685;
        }
        CVar20 = Curl_pin_peer_pubkey(data,pcVar22,pubkey,uVar25);
        (*Curl_cfree)(pubkey);
        if (CVar20 == CURLE_OK) {
          CVar20 = CURLE_OK;
          goto LAB_001526a3;
        }
      }
      Curl_failf(data,"SSL: public key does not match pinned public key!");
    }
LAB_001526a3:
    X509_free((X509 *)psVar3->server_cert);
    psVar3->server_cert = (X509 *)0x0;
    conn->ssl[lVar43].connecting_state = ssl_connect_done;
  }
  if (CVar20 != CURLE_OK) {
    return CVar20;
  }
LAB_001505c3:
  conn->ssl[lVar43].state = ssl_connection_complete;
  conn->recv[local_9d0] = ossl_recv;
  conn->send[local_9d0] = ossl_send;
  _Var12 = true;
LAB_0015071f:
  *local_9d8 = _Var12;
  conn->ssl[lVar43].connecting_state = ssl_connect_1;
  return CURLE_OK;
LAB_001516a4:
  Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",local_a38);
  iVar17 = iVar17 + 1;
  uVar38 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if (iVar51 <= iVar17) goto LAB_001526eb;
  goto LAB_00151601;
LAB_001526eb:
  GENERAL_NAMES_free(a_00);
  goto LAB_00151f24;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}